

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Kind v)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "model";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "group";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "assembly";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "component";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "subcomponent";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "sceneLibrary";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "[[InternalError. UserDefKind]]";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "[[InvalidKind]]";
    pcVar1 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Kind v) {
  if (v == tinyusdz::Kind::Model) {
    return "model";
  } else if (v == tinyusdz::Kind::Group) {
    return "group";
  } else if (v == tinyusdz::Kind::Assembly) {
    return "assembly";
  } else if (v == tinyusdz::Kind::Component) {
    return "component";
  } else if (v == tinyusdz::Kind::Subcomponent) {
    return "subcomponent";
  } else if (v == tinyusdz::Kind::SceneLibrary) {
    return "sceneLibrary";
  } else if (v == tinyusdz::Kind::UserDef) {
    // Should use PrimMeta::get_kind() to get actual Kind string value.
    return "[[InternalError. UserDefKind]]";
  } else {
    return "[[InvalidKind]]";
  }
}